

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableManager.cpp
# Opt level: O3

bool __thiscall
rsg::VariableManager::canDeclareInCurrentScope(VariableManager *this,Variable *variable)

{
  VariableScope *pVVar1;
  __normal_iterator<rsg::Variable_*const_*,_std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>_>
  _Var2;
  
  pVVar1 = (this->m_variableScopeStack).
           super__Vector_base<rsg::VariableScope_*,_std::allocator<rsg::VariableScope_*>_>._M_impl.
           super__Vector_impl_data._M_finish[-1];
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<rsg::Variable*const*,std::vector<rsg::Variable*,std::allocator<rsg::Variable*>>>,__gnu_cxx::__ops::_Iter_equals_val<rsg::Variable_const*const>>
                    ((pVVar1->m_liveVariables).
                     super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (pVVar1->m_liveVariables).
                     super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>._M_impl.
                     super__Vector_impl_data._M_finish);
  return _Var2._M_current !=
         (pVVar1->m_liveVariables).
         super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
}

Assistant:

bool VariableManager::canDeclareInCurrentScope (const Variable* variable) const
{
	const vector<Variable*>& curLiveVars = getCurVariableScope().getLiveVariables();
	return std::find(curLiveVars.begin(), curLiveVars.end(), variable) != curLiveVars.end();
}